

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O1

char * serialize_put(char *w,SBufExt *sbx,cTValue *o)

{
  cTValue *pcVar1;
  int iVar2;
  long *plVar3;
  uint64_t uVar4;
  ulong uVar5;
  bool bVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  byte *pbVar18;
  cTValue *pcVar19;
  uint64_t u;
  ulong uVar20;
  byte local_38;
  
  uVar20 = o->u64;
  uVar9 = (long)uVar20 >> 0x2f;
  iVar16 = (int)w;
  if (uVar9 == 0xfffffffffffffffb) {
    uVar8 = *(uint *)((uVar20 & 0x7fffffffffff) + 0x14);
    if ((uint)(*(int *)&sbx->e - iVar16) < uVar8 + 5) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,uVar8 + 5);
    }
    uVar13 = uVar8 + 0x20;
    if (uVar13 < 0xe0) {
      *w = (char)uVar13;
      pcVar17 = w + 1;
    }
    else {
      pcVar17 = serialize_wu124_(w,uVar13);
    }
    memcpy(pcVar17,(void *)((uVar20 & 0x7fffffffffff) + 0x18),(ulong)uVar8);
    return pcVar17 + uVar8;
  }
  if (uVar9 < 0xfffffffffffffff2) {
    if ((uint)(*(int *)&sbx->e - iVar16) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    *w = 7;
    *(ulong *)((byte *)w + 1) = uVar20;
LAB_001552ca:
    return (char *)((byte *)w + 9);
  }
  if (0xfffffffffffffffc < uVar9) {
    if (*(int *)&sbx->e == iVar16) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,1);
    }
    *w = ~(byte)(o->u64 >> 0x2f);
LAB_0015530d:
    return (char *)((byte *)w + 1);
  }
  if (uVar9 == 0xfffffffffffffffc) {
    uVar9 = uVar20 & 0x7fffffffff |
            (ulong)*(uint *)(*(long *)(*(long *)(((sbx->L).ptr64 & 0xfffffffffffffff8) + 0x10) +
                                      0x70) + (uVar20 >> 0x27 & 0xff) * 4) << 0x20;
    if ((uint)(*(int *)&sbx->e - iVar16) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    if (uVar9 != 0) {
      if (uVar9 >> 0x20 == 0) {
        *w = 4;
        *(int *)((byte *)w + 1) = (int)uVar20;
        return (char *)((byte *)w + 5);
      }
      *w = 5;
      *(ulong *)((byte *)w + 1) = uVar9;
      goto LAB_001552ca;
    }
    *w = 3;
    goto LAB_0015530d;
  }
  if (uVar9 != 0xfffffffffffffff5) {
    if (uVar9 == 0xfffffffffffffff4) {
      if (sbx->depth < 1) {
        lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
      }
      uVar20 = uVar20 & 0x7fffffffffff;
      sbx->depth = sbx->depth + -1;
      uVar13 = 0;
      uVar8 = 2;
      if ((ulong)*(uint *)(uVar20 + 0x30) == 0) {
        uVar9 = 0;
      }
      else {
        uVar5 = (ulong)*(uint *)(uVar20 + 0x30);
        do {
          uVar11 = uVar5;
          uVar9 = 0;
          if ((long)uVar11 < 1) break;
          uVar5 = uVar11 - 1;
          uVar9 = uVar11;
        } while ((*(long **)(uVar20 + 0x10))[uVar11 - 1] == -1);
        if (uVar9 != 0) {
          uVar8 = (uint)(**(long **)(uVar20 + 0x10) == -1) * 2 + 2;
        }
      }
      iVar2 = *(int *)(uVar20 + 0x34);
      if (iVar2 != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          uVar13 = uVar13 + (*(long *)(*(long *)(uVar20 + 0x28) + lVar12) != -1);
          lVar12 = lVar12 + 0x18;
        } while ((ulong)(iVar2 + 1 + (uint)(iVar2 == -1)) * 0x18 != lVar12);
      }
      uVar4 = (sbx->dict_mt).gcptr64;
      if ((uVar4 != 0) && (uVar5 = *(ulong *)(uVar20 + 0x20), uVar5 != 0)) {
        uVar15 = (uint)((uVar5 | 0xfffa000000000000) >> 0x20);
        uVar14 = ((uint)uVar5 ^ uVar15) - (uVar15 << 0xe | uVar15 >> 0x12);
        puVar10 = (uint *)((ulong)(((uVar15 << 0x13 | uVar15 >> 0xd) ^ uVar14) -
                                   (uVar14 * 0x2000 | uVar14 >> 0x13) & *(uint *)(uVar4 + 0x34)) *
                           0x18 + *(long *)(uVar4 + 0x28));
        do {
          if (*(ulong *)(puVar10 + 2) == (uVar5 | 0xfffa000000000000)) {
            uVar14 = *puVar10;
            if ((uint)(*(int *)&sbx->e - iVar16) < 6) {
              sbx->w = w;
              w = lj_buf_more2((SBuf *)sbx,6);
            }
            *w = '\x0e';
            if (uVar14 < 0xe0) {
              w[1] = (char)uVar14;
              w = w + 2;
            }
            else {
              w = serialize_wu124_(w + 1,uVar14);
            }
            break;
          }
          puVar10 = *(uint **)(puVar10 + 4);
        } while (puVar10 != (uint *)0x0);
      }
      if ((uint)(*(int *)&sbx->e - (int)w) < 0xb) {
        sbx->w = w;
        w = lj_buf_more2((SBuf *)sbx,0xb);
      }
      uVar14 = (uint)uVar9;
      local_38 = (byte)uVar8;
      if (uVar14 == 0) {
        local_38 = (byte)uVar9;
      }
      pbVar18 = (byte *)w + 1;
      *w = local_38 | uVar13 == 0 ^ 9U;
      if (uVar14 != 0) {
        if (uVar14 < 0xe0) {
          ((byte *)w)[1] = (byte)uVar9;
          pbVar18 = (byte *)w + 2;
        }
        else {
          pbVar18 = (byte *)serialize_wu124_((char *)pbVar18,uVar14);
        }
      }
      if (uVar13 != 0) {
        if (uVar13 < 0xe0) {
          *pbVar18 = (byte)uVar13;
          pbVar18 = pbVar18 + 1;
        }
        else {
          pbVar18 = (byte *)serialize_wu124_((char *)pbVar18,uVar13);
        }
      }
      if ((uVar14 != 0) && (uVar8 >> 2 < uVar14)) {
        lVar12 = *(long *)(uVar20 + 0x10);
        pcVar19 = (cTValue *)(lVar12 + (ulong)(uVar8 >> 2) * 8);
        do {
          pcVar1 = pcVar19 + 1;
          pbVar18 = (byte *)serialize_put((char *)pbVar18,sbx,pcVar19);
          pcVar19 = pcVar1;
        } while (pcVar1 < (cTValue *)(lVar12 + (uVar9 & 0xffffffff) * 8));
      }
      if (uVar13 == 0) {
LAB_001557cf:
        sbx->depth = sbx->depth + 1;
        return (char *)pbVar18;
      }
      pcVar19 = (cTValue *)((ulong)*(uint *)(uVar20 + 0x34) * 0x18 + *(long *)(uVar20 + 0x28));
      uVar4 = (sbx->dict_str).gcptr64;
      if (uVar4 == 0) {
        do {
          if (pcVar19->u64 != 0xffffffffffffffff) {
            pcVar17 = serialize_put((char *)pbVar18,sbx,pcVar19 + 1);
            pbVar18 = (byte *)serialize_put(pcVar17,sbx,pcVar19);
            uVar13 = uVar13 - 1;
            if (uVar13 == 0) goto LAB_001557cf;
          }
          pcVar19 = pcVar19 + -3;
        } while( true );
      }
      do {
        if (pcVar19->u64 != 0xffffffffffffffff) {
          if ((pcVar19[1].u64 & 0xffff800000000000) == 0xfffd800000000000) {
            uVar20 = pcVar19[1].u64 & 0x7fffffffffff;
            puVar10 = (uint *)((ulong)(*(uint *)(uVar4 + 0x34) & *(uint *)(uVar20 + 0xc)) * 0x18 +
                              *(long *)(uVar4 + 0x28));
            do {
              if (((*(ulong *)(puVar10 + 2) & 0xffff800000000000) == 0xfffd800000000000) &&
                 ((*(ulong *)(puVar10 + 2) & 0x7fffffffffff) == uVar20)) {
                uVar8 = *puVar10;
                if ((uint)(*(int *)&sbx->e - (int)pbVar18) < 6) {
                  sbx->w = (char *)pbVar18;
                  pbVar18 = (byte *)lj_buf_more2((SBuf *)sbx,6);
                }
                *pbVar18 = 0xf;
                if (uVar8 < 0xe0) {
                  pbVar18[1] = (byte)uVar8;
                  pbVar18 = pbVar18 + 2;
                }
                else {
                  pbVar18 = (byte *)serialize_wu124_((char *)(pbVar18 + 1),uVar8);
                }
                goto LAB_00155723;
              }
              puVar10 = *(uint **)(puVar10 + 4);
            } while (puVar10 != (uint *)0x0);
            uVar8 = *(uint *)(uVar20 + 0x14);
            if ((uint)(*(int *)&sbx->e - (int)pbVar18) < uVar8 + 5) {
              sbx->w = (char *)pbVar18;
              pbVar18 = (byte *)lj_buf_more2((SBuf *)sbx,uVar8 + 5);
            }
            uVar14 = uVar8 + 0x20;
            if (uVar14 < 0xe0) {
              *pbVar18 = (byte)uVar14;
              pbVar18 = pbVar18 + 1;
            }
            else {
              pbVar18 = (byte *)serialize_wu124_((char *)pbVar18,uVar14);
            }
            memcpy(pbVar18,(void *)(uVar20 + 0x18),(ulong)uVar8);
            pbVar18 = pbVar18 + uVar8;
          }
          else {
            pbVar18 = (byte *)serialize_put((char *)pbVar18,sbx,pcVar19 + 1);
          }
LAB_00155723:
          pbVar18 = (byte *)serialize_put((char *)pbVar18,sbx,pcVar19);
          uVar13 = uVar13 - 1;
          if (uVar13 == 0) goto LAB_001557cf;
        }
        pcVar19 = pcVar19 + -3;
      } while( true );
    }
    goto LAB_001554d7;
  }
  uVar20 = (sbx->L).ptr64 & 0xfffffffffffffff8;
  plVar3 = *(long **)(*(long *)(uVar20 + 0x10) + 0x180);
  plVar3[2] = uVar20;
  uVar20 = o->u64 & 0x7fffffffffff;
  lVar12 = *plVar3;
  uVar8 = *(uint *)(lVar12 + (ulong)*(ushort *)(uVar20 + 10) * 0x18);
  puVar10 = (uint *)(lVar12 + (ulong)*(ushort *)(uVar20 + 10) * 0x18);
  if ((uVar8 < 0x4000000) && (puVar10[1] == 8)) {
    if ((uint)(*(int *)&sbx->e - iVar16) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    *w = (*puVar10 >> 0x17 & 1) == 0 ^ 0x11;
    *(undefined8 *)((byte *)w + 1) = *(undefined8 *)(uVar20 + 0x10);
    w = (char *)((byte *)w + 9);
LAB_001554c9:
    bVar6 = true;
  }
  else {
    if (((uVar8 & 0xf4000000) == 0x34000000) && (puVar10[1] == 0x10)) {
      if ((uint)(*(int *)&sbx->e - iVar16) < 0x11) {
        sbx->w = w;
        w = lj_buf_more2((SBuf *)sbx,0x11);
      }
      *w = '\x12';
      uVar7 = *(undefined8 *)(uVar20 + 0x18);
      *(undefined8 *)(w + 1) = *(undefined8 *)(uVar20 + 0x10);
      *(undefined8 *)(w + 9) = uVar7;
      w = w + 0x11;
      goto LAB_001554c9;
    }
    bVar6 = false;
  }
  if (bVar6) {
    return (char *)(byte *)w;
  }
LAB_001554d7:
  uVar20 = 0xd;
  if (0xfffffffffffffff2 < (ulong)(o->it64 >> 0x2f)) {
    uVar20 = ~(o->it64 >> 0x2f);
  }
  lj_err_callerv((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_BADENC,
                 lj_obj_itypename[uVar20]);
}

Assistant:

static char *serialize_put(char *w, SBufExt *sbx, cTValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    w = serialize_more(w, sbx, 5+len);
    w = serialize_wu124(w, SER_TAG_STR + len);
    w = lj_buf_wmem(w, strdata(str), len);
  } else if (tvisint(o)) {
    uint32_t x = LJ_BE ? lj_bswap((uint32_t)intV(o)) : (uint32_t)intV(o);
    w = serialize_more(w, sbx, 1+4);
    *w++ = SER_TAG_INT; memcpy(w, &x, 4); w += 4;
  } else if (tvisnum(o)) {
    uint64_t x = LJ_BE ? lj_bswap64(o->u64) : o->u64;
    w = serialize_more(w, sbx, 1+sizeof(lua_Number));
    *w++ = SER_TAG_NUM; memcpy(w, &x, 8); w += 8;
  } else if (tvispri(o)) {
    w = serialize_more(w, sbx, 1);
    *w++ = (char)(SER_TAG_NIL + ~itype(o));
  } else if (tvistab(o)) {
    const GCtab *t = tabV(o);
    uint32_t narray = 0, nhash = 0, one = 2;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (t->asize > 0) {  /* Determine max. length of array part. */
      ptrdiff_t i;
      TValue *array = tvref(t->array);
      for (i = (ptrdiff_t)t->asize-1; i >= 0; i--)
	if (!tvisnil(&array[i]))
	  break;
      narray = (uint32_t)(i+1);
      if (narray && tvisnil(&array[0])) one = 4;
    }
    if (t->hmask > 0) {  /* Count number of used hash slots. */
      uint32_t i, hmask = t->hmask;
      Node *node = noderef(t->node);
      for (i = 0; i <= hmask; i++)
	nhash += !tvisnil(&node[i].val);
    }
    /* Write metatable index. */
    if (LJ_UNLIKELY(tabref(sbx->dict_mt)) && tabref(t->metatable)) {
      TValue mto;
      Node *n;
      settabV(sbufL(sbx), &mto, tabref(t->metatable));
      n = hashgcref(tabref(sbx->dict_mt), mto.gcr);
      do {
	if (n->key.u64 == mto.u64) {
	  uint32_t idx = n->val.u32.lo;
	  w = serialize_more(w, sbx, 1+5);
	  *w++ = SER_TAG_DICT_MT;
	  w = serialize_wu124(w, idx);
	  break;
	}
      } while ((n = nextnode(n)));
    }
    /* Write number of array slots and hash slots. */
    w = serialize_more(w, sbx, 1+2*5);
    *w++ = (char)(SER_TAG_TAB + (nhash ? 1 : 0) + (narray ? one : 0));
    if (narray) w = serialize_wu124(w, narray);
    if (nhash) w = serialize_wu124(w, nhash);
    if (narray) {  /* Write array entries. */
      cTValue *oa = tvref(t->array) + (one >> 2);
      cTValue *oe = tvref(t->array) + narray;
      while (oa < oe) w = serialize_put(w, sbx, oa++);
    }
    if (nhash) {  /* Write hash entries. */
      const Node *node = noderef(t->node) + t->hmask;
      GCtab *dict_str = tabref(sbx->dict_str);
      if (LJ_UNLIKELY(dict_str)) {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    if (LJ_LIKELY(tvisstr(&node->key))) {
	      /* Inlined lj_tab_getstr is 30% faster. */
	      const GCstr *str = strV(&node->key);
	      Node *n = hashstr(dict_str, str);
	      do {
		if (tvisstr(&n->key) && strV(&n->key) == str) {
		  uint32_t idx = n->val.u32.lo;
		  w = serialize_more(w, sbx, 1+5);
		  *w++ = SER_TAG_DICT_STR;
		  w = serialize_wu124(w, idx);
		  break;
		}
		n = nextnode(n);
		if (!n) {
		  MSize len = str->len;
		  w = serialize_more(w, sbx, 5+len);
		  w = serialize_wu124(w, SER_TAG_STR + len);
		  w = lj_buf_wmem(w, strdata(str), len);
		  break;
		}
	      } while (1);
	    } else {
	      w = serialize_put(w, sbx, &node->key);
	    }
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      } else {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    w = serialize_put(w, sbx, &node->key);
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      }
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(sbufL(sbx));
    CType *s = ctype_raw(cts, cdataV(o)->ctypeid);
    uint8_t *sp = cdataptr(cdataV(o));
    if (ctype_isinteger(s->info) && s->size == 8) {
      w = serialize_more(w, sbx, 1+8);
      *w++ = (s->info & CTF_UNSIGNED) ? SER_TAG_UINT64 : SER_TAG_INT64;
#if LJ_BE
      { uint64_t u = lj_bswap64(*(uint64_t *)sp); memcpy(w, &u, 8); }
#else
      memcpy(w, sp, 8);
#endif
      w += 8;
    } else if (ctype_iscomplex(s->info) && s->size == 16) {
      w = serialize_more(w, sbx, 1+16);
      *w++ = SER_TAG_COMPLEX;
#if LJ_BE
      {  /* Only swap the doubles. The re/im order stays the same. */
	uint64_t u = lj_bswap64(((uint64_t *)sp)[0]); memcpy(w, &u, 8);
	u = lj_bswap64(((uint64_t *)sp)[1]); memcpy(w+8, &u, 8);
      }
#else
      memcpy(w, sp, 16);
#endif
      w += 16;
    } else {
      goto badenc;  /* NYI other cdata */
    }
#endif
  } else if (tvislightud(o)) {
    uintptr_t ud = (uintptr_t)lightudV(G(sbufL(sbx)), o);
    w = serialize_more(w, sbx, 1+sizeof(ud));
    if (ud == 0) {
      *w++ = SER_TAG_NULL;
    } else if (LJ_32 || checku32(ud)) {
#if LJ_BE && LJ_64
      ud = lj_bswap64(ud);
#elif LJ_BE
      ud = lj_bswap(ud);
#endif
      *w++ = SER_TAG_LIGHTUD32; memcpy(w, &ud, 4); w += 4;
#if LJ_64
    } else {
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
      *w++ = SER_TAG_LIGHTUD64; memcpy(w, &ud, 8); w += 8;
#endif
    }
  } else {
    /* NYI userdata */
#if LJ_HASFFI
  badenc:
#endif
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADENC, lj_typename(o));
  }
  return w;
}